

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall
duckdb::Value::SerializeInternal(Value *this,Serializer *serializer,bool serialize_type)

{
  PhysicalType PVar1;
  bool bVar2;
  string *psVar3;
  vector<duckdb::Value,_true> *children;
  NotImplementedException *this_00;
  InternalException *this_01;
  uint *puVar4;
  undefined7 in_register_00000011;
  string_t blob;
  allocator local_49;
  string blob_str;
  anon_union_16_2_67f50693_for_value local_28;
  
  if (((int)CONCAT71(in_register_00000011,serialize_type) != 0) ||
     (bVar2 = SerializationCompatibility::Compare
                        (&(serializer->options).serialization_compatibility,4), !bVar2)) {
    Serializer::WriteProperty<duckdb::LogicalType>(serializer,100,"type",&this->type_);
  }
  Serializer::WriteProperty<bool>(serializer,0x65,"is_null",&this->is_null);
  if (this->is_null == false) {
    PVar1 = (this->type_).physical_type_;
    switch(PVar1) {
    case BOOL:
      Serializer::WriteProperty<bool>(serializer,0x66,"value",&(this->value_).boolean);
      return;
    case UINT8:
      Serializer::WriteProperty<unsigned_char>(serializer,0x66,"value",&(this->value_).utinyint);
      return;
    case INT8:
      Serializer::WriteProperty<signed_char>(serializer,0x66,"value",&(this->value_).tinyint);
      return;
    case UINT16:
      Serializer::WriteProperty<unsigned_short>
                (serializer,0x66,"value",(unsigned_short *)&(this->value_).utinyint);
      return;
    case INT16:
      Serializer::WriteProperty<short>(serializer,0x66,"value",(short *)&(this->value_).tinyint);
      return;
    case UINT32:
      Serializer::WriteProperty<unsigned_int>
                (serializer,0x66,"value",(uint *)&(this->value_).utinyint);
      return;
    case INT32:
      Serializer::WriteProperty<int>(serializer,0x66,"value",(int *)&(this->value_).tinyint);
      return;
    case UINT64:
      Serializer::WriteProperty<unsigned_long>
                (serializer,0x66,"value",(unsigned_long *)&(this->value_).utinyint);
      return;
    case INT64:
      Serializer::WriteProperty<long>(serializer,0x66,"value",(long *)&(this->value_).tinyint);
      return;
    case FLOAT:
      Serializer::WriteProperty<float>(serializer,0x66,"value",&(this->value_).float_);
      return;
    case DOUBLE:
      Serializer::WriteProperty<double>(serializer,0x66,"value",&(this->value_).double_);
      return;
    case INTERVAL:
      Serializer::WriteProperty<duckdb::interval_t>
                (serializer,0x66,"value",&(this->value_).interval);
      return;
    case LIST:
      children = ListValue::GetChildren(this);
      break;
    case STRUCT:
      children = StructValue::GetChildren(this);
      break;
    case ARRAY:
      children = ArrayValue::GetChildren(this);
      break;
    default:
      puVar4 = &switchD_016ee211::switchdataD_0200312c;
      switch(PVar1) {
      case VARCHAR:
        if ((this->type_).id_ == BLOB) {
          psVar3 = StringValue::Get_abi_cxx11_(this);
          string_t::string_t((string_t *)&local_28.pointer,psVar3);
          blob.value.pointer.ptr = (char *)puVar4;
          blob.value._0_8_ = local_28.pointer.ptr;
          Blob::ToString_abi_cxx11_(&blob_str,(Blob *)local_28._0_8_,blob);
          Serializer::WriteProperty<std::__cxx11::string>(serializer,0x66,"value",&blob_str);
          ::std::__cxx11::string::~string((string *)&blob_str);
          return;
        }
        psVar3 = StringValue::Get_abi_cxx11_(this);
        Serializer::WriteProperty<std::__cxx11::string>(serializer,0x66,"value",psVar3);
        return;
      case UINT128:
        Serializer::WriteProperty<duckdb::uhugeint_t>
                  (serializer,0x66,"value",&(this->value_).uhugeint);
        return;
      case INT128:
        Serializer::WriteProperty<duckdb::hugeint_t>
                  (serializer,0x66,"value",&(this->value_).hugeint);
        return;
      case BIT:
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&blob_str,"BIT type should not be serialized",&local_49);
        InternalException::InternalException(this_01,(string *)&blob_str);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x16:
    case STRUCT|BOOL:
    case STRUCT|UINT8:
    case STRUCT|INT8:
    case STRUCT|UINT16:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&blob_str,"Unimplemented type for Serialize",&local_49);
      NotImplementedException::NotImplementedException(this_00,(string *)&blob_str);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    SerializeChildren(serializer,children,&this->type_);
    return;
  }
  return;
}

Assistant:

void Value::SerializeInternal(Serializer &serializer, bool serialize_type) const {
	if (serialize_type || !serializer.ShouldSerialize(4)) {
		// only the root value needs to serialize its type
		// for forwards compatibility reasons, we also serialize the type always when targeting versions < v1.2.0
		serializer.WriteProperty(100, "type", type_);
	}
	serializer.WriteProperty(101, "is_null", is_null);
	if (IsNull()) {
		return;
	}
	switch (type_.InternalType()) {
	case PhysicalType::BIT:
		throw InternalException("BIT type should not be serialized");
	case PhysicalType::BOOL:
		serializer.WriteProperty(102, "value", value_.boolean);
		break;
	case PhysicalType::INT8:
		serializer.WriteProperty(102, "value", value_.tinyint);
		break;
	case PhysicalType::INT16:
		serializer.WriteProperty(102, "value", value_.smallint);
		break;
	case PhysicalType::INT32:
		serializer.WriteProperty(102, "value", value_.integer);
		break;
	case PhysicalType::INT64:
		serializer.WriteProperty(102, "value", value_.bigint);
		break;
	case PhysicalType::UINT8:
		serializer.WriteProperty(102, "value", value_.utinyint);
		break;
	case PhysicalType::UINT16:
		serializer.WriteProperty(102, "value", value_.usmallint);
		break;
	case PhysicalType::UINT32:
		serializer.WriteProperty(102, "value", value_.uinteger);
		break;
	case PhysicalType::UINT64:
		serializer.WriteProperty(102, "value", value_.ubigint);
		break;
	case PhysicalType::INT128:
		serializer.WriteProperty(102, "value", value_.hugeint);
		break;
	case PhysicalType::UINT128:
		serializer.WriteProperty(102, "value", value_.uhugeint);
		break;
	case PhysicalType::FLOAT:
		serializer.WriteProperty(102, "value", value_.float_);
		break;
	case PhysicalType::DOUBLE:
		serializer.WriteProperty(102, "value", value_.double_);
		break;
	case PhysicalType::INTERVAL:
		serializer.WriteProperty(102, "value", value_.interval);
		break;
	case PhysicalType::VARCHAR: {
		if (type_.id() == LogicalTypeId::BLOB) {
			auto blob_str = Blob::ToString(StringValue::Get(*this));
			serializer.WriteProperty(102, "value", blob_str);
		} else {
			serializer.WriteProperty(102, "value", StringValue::Get(*this));
		}
	} break;
	case PhysicalType::LIST:
		SerializeChildren(serializer, ListValue::GetChildren(*this), type_);
		break;
	case PhysicalType::STRUCT:
		SerializeChildren(serializer, StructValue::GetChildren(*this), type_);
		break;
	case PhysicalType::ARRAY:
		SerializeChildren(serializer, ArrayValue::GetChildren(*this), type_);
		break;
	default:
		throw NotImplementedException("Unimplemented type for Serialize");
	}
}